

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_dbp_encoder.hpp
# Opt level: O1

void __thiscall
duckdb::DbpEncoder::BeginWrite<duckdb::string_t>
          (DbpEncoder *this,WriteStream *writer,string_t *first_value)

{
  InternalException *this_00;
  string local_40;
  
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"DbpEncoder should only be used with integers","");
  InternalException::InternalException(this_00,&local_40);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void BeginWrite(WriteStream &writer, const T &first_value) {
		throw InternalException("DbpEncoder should only be used with integers");
	}